

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::dotRS(Forth *this)

{
  Cell __base;
  _Setbase _Var1;
  uint uVar2;
  ostream *poVar3;
  Cell local_1c;
  Cell i;
  Cell depth;
  Forth *this_local;
  
  local_1c = ForthStack<unsigned_int>::stackDepth(&this->rStack);
  __base = getNumericBase(this);
  _Var1 = std::setbase(__base);
  poVar3 = std::operator<<((ostream *)&this->field_0x20,_Var1);
  poVar3 = std::operator<<(poVar3,"<<");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_1c);
  std::operator<<(poVar3,">> ");
  for (; local_1c != 0; local_1c = local_1c - 1) {
    if (this->writeToTarget == ToString) {
      uVar2 = ForthStack<unsigned_int>::getTop(&this->rStack,(ulong)(local_1c - 1));
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&this->field_0x20,uVar2);
      std::operator<<(poVar3," ");
    }
    else if (this->writeToTarget == ToStdCout) {
      uVar2 = ForthStack<unsigned_int>::getTop(&this->rStack,(ulong)(local_1c - 1));
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar2);
      std::operator<<(poVar3," ");
      std::ostream::flush();
    }
  }
  return;
}

Assistant:

void dotRS() {
#ifndef FORTHSCRIPTCPP_DISABLE_OUTPUT
			auto depth = rStack.stackDepth();
			std_cout << SETBASE() << "<<" << depth << ">> ";
			for (auto i = depth; i > 0; --i) {
				switch (writeToTarget) {
				case ToString:
					std_cout << static_cast<SCell>(rStack.getTop(i - 1)) << " ";
					break;
				case ToStdCout:
					std::cout << static_cast<SCell>(rStack.getTop(i - 1)) << " ";
					std::cout.flush();
					break;
				default:
					break;
				}
			}
#endif
		}